

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O1

Matrix4f *
Matrix4f::perspectiveProjection
          (Matrix4f *__return_storage_ptr__,float fLeft,float fRight,float fBottom,float fTop,
          float fZNear,float fZFar,bool directX)

{
  undefined3 in_register_00000031;
  Matrix4f *projection;
  float fVar1;
  float fVar2;
  float fVar3;
  
  __return_storage_ptr__->m_elements[0] = 0.0;
  __return_storage_ptr__->m_elements[1] = 0.0;
  __return_storage_ptr__->m_elements[2] = 0.0;
  __return_storage_ptr__->m_elements[3] = 0.0;
  __return_storage_ptr__->m_elements[4] = 0.0;
  __return_storage_ptr__->m_elements[5] = 0.0;
  __return_storage_ptr__->m_elements[6] = 0.0;
  __return_storage_ptr__->m_elements[7] = 0.0;
  __return_storage_ptr__->m_elements[8] = 0.0;
  __return_storage_ptr__->m_elements[9] = 0.0;
  __return_storage_ptr__->m_elements[10] = 0.0;
  __return_storage_ptr__->m_elements[0xb] = 0.0;
  __return_storage_ptr__->m_elements[0xc] = 0.0;
  __return_storage_ptr__->m_elements[0xd] = 0.0;
  __return_storage_ptr__->m_elements[0xe] = 0.0;
  __return_storage_ptr__->m_elements[0xf] = 0.0;
  fVar3 = fZNear + fZNear;
  __return_storage_ptr__->m_elements[0] = fVar3 / (fRight - fLeft);
  __return_storage_ptr__->m_elements[5] = fVar3 / (fTop - fBottom);
  __return_storage_ptr__->m_elements[8] = (fLeft + fRight) / (fRight - fLeft);
  __return_storage_ptr__->m_elements[9] = (fBottom + fTop) / (fTop - fBottom);
  __return_storage_ptr__->m_elements[0xb] = -1.0;
  fVar1 = fZNear;
  fVar2 = fZFar;
  if (CONCAT31(in_register_00000031,directX) == 0) {
    fVar2 = fZNear + fZFar;
    fVar1 = fVar3;
  }
  __return_storage_ptr__->m_elements[10] = fVar2 / (fZNear - fZFar);
  __return_storage_ptr__->m_elements[0xe] = (fVar1 * fZFar) / (fZNear - fZFar);
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::perspectiveProjection( float fLeft, float fRight,
										 float fBottom, float fTop,
										 float fZNear, float fZFar,
										 bool directX )
{
	Matrix4f projection; // zero matrix

	projection( 0, 0 ) = ( 2.0f * fZNear ) / ( fRight - fLeft );
	projection( 1, 1 ) = ( 2.0f * fZNear ) / ( fTop - fBottom );
	projection( 0, 2 ) = ( fRight + fLeft ) / ( fRight - fLeft );
	projection( 1, 2 ) = ( fTop + fBottom ) / ( fTop - fBottom );
	projection( 3, 2 ) = -1;

	if( directX )
	{
		projection( 2, 2 ) = fZFar / ( fZNear - fZFar);
		projection( 2, 3 ) = ( fZNear * fZFar ) / ( fZNear - fZFar );
	}
	else
	{
		projection( 2, 2 ) = ( fZNear + fZFar ) / ( fZNear - fZFar );
		projection( 2, 3 ) = ( 2.0f * fZNear * fZFar ) / ( fZNear - fZFar );
	}

	return projection;
}